

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverSearch.c
# Opt level: O0

int Msat_SolverSimplifyDB(Msat_Solver_t *p)

{
  int iVar1;
  int iVar2;
  Msat_Clause_t *pMVar3;
  int *pAssigns_00;
  Msat_Clause_t **ppMVar4;
  Msat_ClauseVec_t *local_50;
  int local_44;
  int Counter;
  int *pAssigns;
  int j;
  int i;
  int Type;
  int nClauses;
  Msat_Clause_t **pClauses;
  Msat_ClauseVec_t *vClauses;
  Msat_Solver_t *p_local;
  
  iVar1 = Msat_SolverReadDecisionLevel(p);
  if (iVar1 == 0) {
    pMVar3 = Msat_SolverPropagate(p);
    if (pMVar3 == (Msat_Clause_t *)0x0) {
      local_44 = 0;
      pAssigns_00 = Msat_SolverReadAssignsArray(p);
      for (j = 0; j < 2; j = j + 1) {
        if (j == 0) {
          local_50 = p->vClauses;
        }
        else {
          local_50 = p->vLearned;
        }
        iVar1 = Msat_ClauseVecReadSize(local_50);
        ppMVar4 = Msat_ClauseVecReadArray(local_50);
        pAssigns._0_4_ = 0;
        for (pAssigns._4_4_ = 0; pAssigns._4_4_ < iVar1; pAssigns._4_4_ = pAssigns._4_4_ + 1) {
          iVar2 = Msat_ClauseSimplify(ppMVar4[pAssigns._4_4_],pAssigns_00);
          if (iVar2 == 0) {
            ppMVar4[(int)pAssigns] = ppMVar4[pAssigns._4_4_];
            Msat_ClauseSetNum(ppMVar4[pAssigns._4_4_],local_44);
            local_44 = local_44 + 1;
            pAssigns._0_4_ = (int)pAssigns + 1;
          }
          else {
            Msat_ClauseFree(p,ppMVar4[pAssigns._4_4_],1);
          }
        }
        Msat_ClauseVecShrink(local_50,(int)pAssigns);
      }
      p->nClauses = local_44;
      p_local._4_4_ = 1;
    }
    else {
      p_local._4_4_ = 0;
    }
    return p_local._4_4_;
  }
  __assert_fail("Msat_SolverReadDecisionLevel(p) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/msat/msatSolverSearch.c"
                ,0x122,"int Msat_SolverSimplifyDB(Msat_Solver_t *)");
}

Assistant:

int  Msat_SolverSimplifyDB( Msat_Solver_t * p )
{
    Msat_ClauseVec_t * vClauses;
    Msat_Clause_t ** pClauses;
    int nClauses, Type, i, j;
    int * pAssigns;
    int Counter;

    assert( Msat_SolverReadDecisionLevel(p) == 0 );
    if ( Msat_SolverPropagate(p) != NULL )
        return 0;
//Msat_SolverPrintClauses( p );
//Msat_SolverPrintAssignment( p );
//printf( "Simplification\n" );

    // simplify and reassign clause numbers
    Counter = 0;
    pAssigns = Msat_SolverReadAssignsArray( p );
    for ( Type = 0; Type < 2; Type++ )
    {
        vClauses = Type? p->vLearned : p->vClauses;
        nClauses = Msat_ClauseVecReadSize( vClauses );
        pClauses = Msat_ClauseVecReadArray( vClauses );
        for ( i = j = 0; i < nClauses; i++ )
            if ( Msat_ClauseSimplify( pClauses[i], pAssigns ) )
                Msat_ClauseFree( p, pClauses[i], 1 );
            else
            {
                pClauses[j++] = pClauses[i];
                Msat_ClauseSetNum( pClauses[i], Counter++ );
            }
        Msat_ClauseVecShrink( vClauses, j );
    }
    p->nClauses = Counter;
    return 1;
}